

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# preset_zone.cpp
# Opt level: O0

void __thiscall
sf2cute::SFPresetZone::set_instrument
          (SFPresetZone *this,weak_ptr<sf2cute::SFInstrument> *instrument)

{
  bool bVar1;
  SoundFont *this_00;
  shared_ptr<sf2cute::SFInstrument> local_28;
  weak_ptr<sf2cute::SFInstrument> *local_18;
  weak_ptr<sf2cute::SFInstrument> *instrument_local;
  SFPresetZone *this_local;
  
  local_18 = instrument;
  instrument_local = (weak_ptr<sf2cute::SFInstrument> *)this;
  bVar1 = has_parent_file(this);
  if ((bVar1) &&
     (bVar1 = std::__weak_ptr<sf2cute::SFInstrument,_(__gnu_cxx::_Lock_policy)2>::expired
                        (&instrument->
                          super___weak_ptr<sf2cute::SFInstrument,_(__gnu_cxx::_Lock_policy)2>),
     !bVar1)) {
    this_00 = parent_file(this);
    std::weak_ptr<sf2cute::SFInstrument>::lock((weak_ptr<sf2cute::SFInstrument> *)&local_28);
    SoundFont::AddInstrument(this_00,&local_28);
    std::shared_ptr<sf2cute::SFInstrument>::~shared_ptr(&local_28);
  }
  std::weak_ptr<sf2cute::SFInstrument>::operator=(&this->instrument_,instrument);
  return;
}

Assistant:

void SFPresetZone::set_instrument(std::weak_ptr<SFInstrument> instrument) {
  if (has_parent_file() && !instrument.expired()) {
    parent_file().AddInstrument(instrument.lock());
  }
  instrument_ = std::move(instrument);
}